

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber * uprv_decNumberLog10_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint uVar1;
  uint32_t uVar2;
  decNumber *res_00;
  decNumber *res_01;
  int iVar3;
  decNumber *buffer;
  decNumber *buffer_00;
  uint32_t local_fc;
  uint32_t ignore;
  decContext aset;
  decNumber local_d8 [2];
  decNumber bufa [5];
  decNumber bufb [5];
  
  local_fc = 0;
  ignore = 0;
  uVar2 = decCheckMath(rhs,set,&local_fc);
  if (uVar2 == 0) {
    uprv_decContextDefault_63(&aset,0x40);
    if ((rhs->bits < 0x10) && ((rhs->lsu[0] != '\0' || (rhs->digits != 1)))) {
      bufa[0].digits = 0;
      bufb[0].digits = 0;
      aset.digits = 1;
      decCopyFit(local_d8,rhs,&aset,&bufa[0].digits,(uint32_t *)bufb);
      if (((bufb[0].digits & 0x20U) == 0) && (local_d8[0].lsu[0] == '\x01')) {
        uprv_decNumberFromInt32_63(local_d8,local_d8[0].exponent);
        bufa[0].digits = 0;
        decCopyFit(res,local_d8,set,&bufa[0].digits,&local_fc);
        decFinalize(res,set,&bufa[0].digits,&local_fc);
        goto LAB_00251f7c;
      }
    }
    iVar3 = rhs->digits + 6;
    if (iVar3 <= set->digits) {
      iVar3 = set->digits;
    }
    if (iVar3 < 0x2f) {
      res_00 = bufa;
      buffer_00 = (decNumber *)0x0;
    }
    else {
      res_00 = (decNumber *)uprv_malloc_63((ulong)(iVar3 + 0xe));
      buffer_00 = res_00;
      if (res_00 == (decNumber *)0x0) {
        uVar2 = local_fc | 0x10;
        goto LAB_00251f84;
      }
    }
    aset.digits = iVar3 + 3;
    aset.emax = 999999;
    aset.emin = -999999;
    aset.clamp = '\0';
    decLnOp(res_00,rhs,&aset,&local_fc);
    uVar2 = local_fc;
    if ((local_fc & 0xdd) == 0 || (local_fc >> 0x1e & 1) != 0) {
      if (((res_00->bits & 0x70) != 0) || ((res_00->lsu[0] == '\0' && (res_00->digits == 1)))) {
        uprv_decNumberCopy_63(res,res_00);
        goto LAB_002520dc;
      }
      uVar1 = set->digits;
      if ((int)uVar1 < 0x2f) {
        res_01 = bufb;
        buffer = (decNumber *)0x0;
      }
      else {
        res_01 = (decNumber *)uprv_malloc_63((ulong)uVar1 + 0xe);
        buffer = res_01;
        if (res_01 == (decNumber *)0x0) {
          local_fc = uVar2 | 0x10;
          goto LAB_002520dc;
        }
      }
      aset.digits = uVar1 + 3;
      local_d8[0].bits = '\0';
      local_d8[0].lsu[0] = '\0';
      local_d8[0]._10_1_ = 1;
      local_d8[0].digits = 2;
      local_d8[0].exponent = 0;
      decLnOp(res_01,local_d8,&aset,&ignore);
      aset.digits = set->digits;
      decDivideOp(res,res_00,res_01,&aset,0x80,&local_fc);
    }
    else {
LAB_002520dc:
      buffer = (decNumber *)0x0;
    }
    if (buffer_00 != (decNumber *)0x0) {
      uprv_free_63(buffer_00);
    }
    if (buffer != (decNumber *)0x0) {
      uprv_free_63(buffer);
    }
  }
LAB_00251f7c:
  uVar2 = local_fc;
  if (local_fc == 0) {
    return res;
  }
LAB_00251f84:
  decStatus(res,uVar2,set);
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberLog10(decNumber *res, const decNumber *rhs,
                          decContext *set) {
  uInt status=0, ignore=0;         /* status accumulators  */
  uInt needbytes;                  /* for space calculations  */
  Int p;                           /* working precision  */
  Int t;                           /* digits in exponent of A  */

  /* buffers for a and b working decimals  */
  /* (adjustment calculator, same size)  */
  decNumber bufa[D2N(DECBUFFER+2)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *a=bufa;               /* temporary a  */
  decNumber bufb[D2N(DECBUFFER+2)];
  decNumber *allocbufb=NULL;       /* -> allocated bufb, iff allocated  */
  decNumber *b=bufb;               /* temporary b  */
  decNumber bufw[D2N(10)];         /* working 2-10 digit number  */
  decNumber *w=bufw;               /* ..  */
  #if DECSUBSET
  decNumber *allocrhs=NULL;        /* non-NULL if rounded rhs allocated  */
  #endif

  decContext aset;                 /* working context  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* Check restrictions; this is a math function; if not violated  */
  /* then carry out the operation.  */
  if (!decCheckMath(rhs, set, &status)) do { /* protect malloc  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operand and set lostDigits status, as needed  */
      if (rhs->digits>set->digits) {
        allocrhs=decRoundOperand(rhs, set, &status);
        if (allocrhs==NULL) break;
        rhs=allocrhs;
        }
      /* special check in subset for rhs=0  */
      if (ISZERO(rhs)) {                /* +/- zeros -> error  */
        status|=DEC_Invalid_operation;
        break;}
      } /* extended=0  */
    #endif

    uprv_decContextDefault(&aset, DEC_INIT_DECIMAL64); /* clean context  */

    /* handle exact powers of 10; only check if +ve finite  */
    if (!(rhs->bits&(DECNEG|DECSPECIAL)) && !ISZERO(rhs)) {
      Int residue=0;               /* (no residue)  */
      uInt copystat=0;             /* clean status  */

      /* round to a single digit...  */
      aset.digits=1;
      decCopyFit(w, rhs, &aset, &residue, &copystat); /* copy & shorten  */
      /* if exact and the digit is 1, rhs is a power of 10  */
      if (!(copystat&DEC_Inexact) && w->lsu[0]==1) {
        /* the exponent, conveniently, is the power of 10; making  */
        /* this the result needs a little care as it might not fit,  */
        /* so first convert it into the working number, and then move  */
        /* to res  */
        uprv_decNumberFromInt32(w, w->exponent);
        residue=0;
        decCopyFit(res, w, set, &residue, &status); /* copy & round  */
        decFinish(res, set, &residue, &status);     /* cleanup/set flags  */
        break;
        } /* not a power of 10  */
      } /* not a candidate for exact  */

    /* simplify the information-content calculation to use 'total  */
    /* number of digits in a, including exponent' as compared to the  */
    /* requested digits, as increasing this will only rarely cost an  */
    /* iteration in ln(a) anyway  */
    t=6;                                /* it can never be >6  */

    /* allocate space when needed...  */
    p=(rhs->digits+t>set->digits?rhs->digits+t:set->digits)+3;
    needbytes=sizeof(decNumber)+(D2U(p)-1)*sizeof(Unit);
    if (needbytes>sizeof(bufa)) {       /* need malloc space  */
      allocbufa=(decNumber *)malloc(needbytes);
      if (allocbufa==NULL) {            /* hopeless -- abandon  */
        status|=DEC_Insufficient_storage;
        break;}
      a=allocbufa;                      /* use the allocated space  */
      }
    aset.digits=p;                      /* as calculated  */
    aset.emax=DEC_MAX_MATH;             /* usual bounds  */
    aset.emin=-DEC_MAX_MATH;            /* ..  */
    aset.clamp=0;                       /* and no concrete format  */
    decLnOp(a, rhs, &aset, &status);    /* a=ln(rhs)  */

    /* skip the division if the result so far is infinite, NaN, or  */
    /* zero, or there was an error; note NaN from sNaN needs copy  */
    if (status&DEC_NaNs && !(status&DEC_sNaN)) break;
    if (a->bits&DECSPECIAL || ISZERO(a)) {
      uprv_decNumberCopy(res, a);            /* [will fit]  */
      break;}

    /* for ln(10) an extra 3 digits of precision are needed  */
    p=set->digits+3;
    needbytes=sizeof(decNumber)+(D2U(p)-1)*sizeof(Unit);
    if (needbytes>sizeof(bufb)) {       /* need malloc space  */
      allocbufb=(decNumber *)malloc(needbytes);
      if (allocbufb==NULL) {            /* hopeless -- abandon  */
        status|=DEC_Insufficient_storage;
        break;}
      b=allocbufb;                      /* use the allocated space  */
      }
    uprv_decNumberZero(w);                   /* set up 10...  */
    #if DECDPUN==1
    w->lsu[1]=1; w->lsu[0]=0;           /* ..  */
    #else
    w->lsu[0]=10;                       /* ..  */
    #endif
    w->digits=2;                        /* ..  */

    aset.digits=p;
    decLnOp(b, w, &aset, &ignore);      /* b=ln(10)  */

    aset.digits=set->digits;            /* for final divide  */
    decDivideOp(res, a, b, &aset, DIVIDE, &status); /* into result  */
    } while(0);                         /* [for break]  */

  if (allocbufa!=NULL) free(allocbufa); /* drop any storage used  */
  if (allocbufb!=NULL) free(allocbufb); /* ..  */
  #if DECSUBSET
  if (allocrhs !=NULL) free(allocrhs);  /* ..  */
  #endif
  /* apply significant status  */
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }